

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  ushort uVar1;
  int iVar2;
  StkId pTVar3;
  StkId pTVar4;
  GCObject *pGVar5;
  int *piVar6;
  uint __line;
  long lVar7;
  char *__assertion;
  
  if (from == to) {
    return;
  }
  iVar2 = **(int **)&to[-1].hookmask;
  **(int **)&to[-1].hookmask = iVar2 + 1;
  if (iVar2 == 0) {
    lVar7 = (long)n;
    if (lVar7 < (long)from->top - (long)from->ci->func >> 4) {
      if (from->l_G != to->l_G) {
        __assert_fail("((from->l_G) == (to->l_G)) && \"moving among independent states\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x80,"void lua_xmove(lua_State *, lua_State *, int)");
      }
      if (lVar7 <= (long)to->ci->top - (long)to->top >> 4) {
        from->top = from->top + -lVar7;
        lVar7 = 0;
        while( true ) {
          if ((ulong)(uint)(~(n >> 0x1f) & n) << 4 == lVar7) {
            piVar6 = *(int **)&to[-1].hookmask;
            *piVar6 = *piVar6 + -1;
            if (*piVar6 == 0) {
              return;
            }
            __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(to) - sizeof(struct L_EXTRA)))))->plock) == 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x87,"void lua_xmove(lua_State *, lua_State *, int)");
          }
          pTVar3 = from->top;
          pTVar4 = to->top;
          pGVar5 = *(GCObject **)((long)&pTVar3->value_ + lVar7);
          (pTVar4->value_).gc = pGVar5;
          uVar1 = *(ushort *)((long)&pTVar3->tt_ + lVar7);
          pTVar4->tt_ = uVar1;
          if (((short)uVar1 < 0) &&
             (((uVar1 & 0x7f) != (ushort)pGVar5->tt ||
              ((pGVar5->marked & (to->l_G->currentwhite ^ 0x18)) != 0)))) break;
          to->top = to->top + 1;
          lVar7 = lVar7 + 0x10;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x84,"void lua_xmove(lua_State *, lua_State *, int)");
      }
      __assert_fail("(to->ci->top - to->top >= n) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x81,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    __assertion = "((n) < (from->top - from->ci->func)) && \"not enough elements in the stack\"";
    __line = 0x7f;
  }
  else {
    __assertion = 
    "(*((struct L_EXTRA*)(((void *)((char *)(to) - sizeof(struct L_EXTRA)))))->plock)++ == 0";
    __line = 0x7e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,__line,"void lua_xmove(lua_State *, lua_State *, int)");
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to), "moving among independent states");
  api_check(from, to->ci->top - to->top >= n, "stack overflow");
  from->top -= n;
  for (i = 0; i < n; i++) {
    setobj2s(to, to->top, from->top + i);
    to->top++;  /* stack already checked by previous 'api_check' */
  }
  lua_unlock(to);
}